

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

QTreeWidgetItem * __thiscall QTreeWidgetItem::takeChild(QTreeWidgetItem *this,int index)

{
  QTreeWidgetItem *this_00;
  QTreeWidgetItem *pQVar1;
  value_type pQVar2;
  int c;
  ulong uVar3;
  QTreeWidgetItemPrivate *this_01;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QTreeWidgetItem_*> local_58;
  long local_38;
  
  this_01 = (QTreeWidgetItemPrivate *)&local_58;
  uVar3 = (ulong)(uint)index;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this;
  this_00 = (QTreeWidgetItem *)treeModel(this,(QTreeWidget *)0x0);
  if (this_00 != (QTreeWidgetItem *)0x0) {
    *(undefined1 *)((long)&(this_00->children).d.size + 4) = 0;
    pQVar1 = this_00;
    QTreeModel::executePendingSort((QTreeModel *)this_00);
  }
  if ((index < 0) || ((ulong)(this->children).d.size <= uVar3)) {
    pQVar1 = (QTreeWidgetItem *)0x0;
  }
  else {
    if (this_00 != (QTreeWidgetItem *)0x0) {
      pQVar1 = this_00;
      QTreeModel::beginRemoveItems((QTreeModel *)this_00,this,index,1);
    }
    QTreeWidgetItemPrivate::updateHiddenStatus
              ((QTreeWidgetItemPrivate *)pQVar1,(this->children).d.ptr[uVar3],false);
    pQVar1 = QList<QTreeWidgetItem_*>::takeAt(&this->children,uVar3);
    pQVar1->par = (QTreeWidgetItem *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QTreeWidgetItem **)0x0;
    local_58.size = 0;
    QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_58,pQVar1);
    while ((QVariant *)local_58.size != (QVariant *)0x0) {
      this_01 = (QTreeWidgetItemPrivate *)&local_58;
      pQVar2 = QList<QTreeWidgetItem_*>::takeLast((QList<QTreeWidgetItem_*> *)&local_58);
      pQVar2->view = (QTreeWidget *)0x0;
      lVar4 = 0;
      for (uVar3 = 0; uVar3 < (ulong)(pQVar2->children).d.size; uVar3 = uVar3 + 1) {
        this_01 = (QTreeWidgetItemPrivate *)&local_58;
        QStack<QTreeWidgetItem_*>::push
                  ((QStack<QTreeWidgetItem_*> *)&local_58,
                   (QTreeWidgetItem **)((long)(pQVar2->children).d.ptr + lVar4));
        lVar4 = lVar4 + 8;
      }
    }
    QTreeWidgetItemPrivate::propagateDisabled(this_01,pQVar1);
    if (this_00 != (QTreeWidgetItem *)0x0) {
      QAbstractItemModel::endRemoveRows();
    }
    QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidgetItem::takeChild(int index)
{
    // we move this outside the check of the index to allow executing
    // pending sorts from inline functions, using this function (hack)
    QTreeModel *model = treeModel();
    if (model) {
        // This will trigger a layoutChanged signal, thus we might want to optimize
        // this function by not emitting the rowsRemoved signal etc to the view.
        // On the other hand we also need to make sure that the selectionmodel
        // is updated in case we take an item that is selected.
        model->skipPendingSort = false;
        model->executePendingSort();
    }
    if (index >= 0 && index < children.size()) {
        if (model) model->beginRemoveItems(this, index, 1);
        d->updateHiddenStatus(children.at(index), false);
        QTreeWidgetItem *item = children.takeAt(index);
        item->par = nullptr;
        QStack<QTreeWidgetItem*> stack;
        stack.push(item);
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = nullptr;
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        d->propagateDisabled(item);
        if (model) model->endRemoveRows();
        return item;
    }
    return nullptr;
}